

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeExtractSampleLists.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  runtime_error *this;
  long *plVar2;
  long *plVar3;
  ifstream in;
  TestLogParser parser;
  SampleListParser resultHandler;
  deUint8 buf [1024];
  long *local_940;
  long local_938;
  long local_930;
  long lStack_928;
  long *local_920;
  long local_918;
  long local_910;
  long lStack_908;
  undefined1 *local_900 [2];
  undefined1 local_8f0 [16];
  long *local_8e0 [2];
  long local_8d0 [2];
  int aiStack_8c0 [122];
  TestLogParser local_6d8;
  TestLogHandler local_568;
  TestResultParser local_560;
  string local_438 [32];
  
  if (argc == 2) {
    std::ifstream::ifstream(local_8e0,argv[1],_S_in|_S_bin);
    local_568._vptr_TestLogHandler = (_func_int **)&PTR__SampleListParser_00120090;
    xe::TestResultParser::TestResultParser(&local_560);
    xe::TestLogParser::TestLogParser(&local_6d8,&local_568);
    if (*(int *)((long)aiStack_8c0 + local_8e0[0][-3]) != 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      local_900[0] = local_8f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_900,"Failed to open \'","");
      plVar2 = (long *)std::__cxx11::string::append((char *)local_900);
      local_940 = (long *)*plVar2;
      plVar3 = plVar2 + 2;
      if (local_940 == plVar3) {
        local_930 = *plVar3;
        lStack_928 = plVar2[3];
        local_940 = &local_930;
      }
      else {
        local_930 = *plVar3;
      }
      local_938 = plVar2[1];
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_940);
      local_920 = (long *)*plVar2;
      plVar3 = plVar2 + 2;
      if (local_920 == plVar3) {
        local_910 = *plVar3;
        lStack_908 = plVar2[3];
        local_920 = &local_910;
      }
      else {
        local_910 = *plVar3;
      }
      local_918 = plVar2[1];
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::runtime_error::runtime_error(this,(string *)&local_920);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    while( true ) {
      std::istream::read((char *)local_8e0,(long)local_438);
      if ((int)(uint)local_8e0[1] < 1) break;
      xe::TestLogParser::parse
                (&local_6d8,(deUint8 *)local_438,(ulong)((uint)local_8e0[1] & 0x7fffffff));
    }
    std::ifstream::close();
    xe::TestLogParser::~TestLogParser(&local_6d8);
    local_568._vptr_TestLogHandler = (_func_int **)&PTR__SampleListParser_00120090;
    xe::TestResultParser::~TestResultParser(&local_560);
    std::ifstream::~ifstream(local_8e0);
    iVar1 = 0;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_8e0,*argv,(allocator<char> *)&local_6d8);
    de::FilePath::getBaseName_abi_cxx11_(local_438,(FilePath *)local_8e0);
    printf("%s: [filename]\n",local_438[0]._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
      operator_delete(local_438[0]._M_dataplus._M_p,local_438[0].field_2._M_allocated_capacity + 1);
    }
    if (local_8e0[0] != local_8d0) {
      operator_delete(local_8e0[0],local_8d0[0] + 1);
    }
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int main (int argc, const char* const* argv)
{
	if (argc != 2)
	{
		printf("%s: [filename]\n", de::FilePath(argv[0]).getBaseName().c_str());
		return -1;
	}

	try
	{
		processLogFile(argv[1]);
	}
	catch (const std::exception& e)
	{
		printf("FATAL ERROR: %s\n", e.what());
		return -1;
	}

	return 0;
}